

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O0

StringRef llvm::DWARFUnitIndex::getColumnHeader(DWARFSectionKind DS)

{
  undefined1 auStack_18 [4];
  DWARFSectionKind DS_local;
  
  switch(DS) {
  case DW_SECT_INFO:
    StringRef::StringRef((StringRef *)auStack_18,"INFO");
    break;
  case DW_SECT_TYPES:
    StringRef::StringRef((StringRef *)auStack_18,"TYPES");
    break;
  case DW_SECT_ABBREV:
    StringRef::StringRef((StringRef *)auStack_18,"ABBREV");
    break;
  case DW_SECT_LINE:
    StringRef::StringRef((StringRef *)auStack_18,"LINE");
    break;
  case DW_SECT_LOC:
    StringRef::StringRef((StringRef *)auStack_18,"LOC");
    break;
  case DW_SECT_STR_OFFSETS:
    StringRef::StringRef((StringRef *)auStack_18,"STR_OFFSETS");
    break;
  case DW_SECT_MACINFO:
    StringRef::StringRef((StringRef *)auStack_18,"MACINFO");
    break;
  case DW_SECT_MACRO:
    StringRef::StringRef((StringRef *)auStack_18,"MACRO");
    break;
  default:
    llvm_unreachable_internal
              ("unknown DWARFSectionKind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnitIndex.cpp"
               ,0x79);
  }
  return _auStack_18;
}

Assistant:

StringRef DWARFUnitIndex::getColumnHeader(DWARFSectionKind DS) {
#define CASE(DS)                                                               \
  case DW_SECT_##DS:                                                           \
    return #DS;
  switch (DS) {
    CASE(INFO);
    CASE(TYPES);
    CASE(ABBREV);
    CASE(LINE);
    CASE(LOC);
    CASE(STR_OFFSETS);
    CASE(MACINFO);
    CASE(MACRO);
  }
  llvm_unreachable("unknown DWARFSectionKind");
}